

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::SwitchStatement(SQCompiler *this)

{
  SQFuncState *pSVar1;
  SQInteger SVar2;
  long lVar3;
  bool bVar4;
  SQInteger SVar5;
  SQUnsignedInteger SVar6;
  SQInteger SVar7;
  SQObject SVar8;
  SQInteger oldouters_1;
  SQScope __oldscope___1;
  SQInteger oldouters;
  SQScope __oldscope__;
  SQUnsignedInteger SStack_90;
  bool local;
  SQInteger eqtarget;
  SQInteger trg;
  longlong local_70;
  SQUnsignedInteger local_68;
  SQInteger __nbreaks__;
  SQInteger skipcondjmp;
  SQInteger tonextcondjmp;
  SQInteger SStack_48;
  bool bfirst;
  SQInteger expr;
  SQObjectValue local_38;
  SQObjectType local_30;
  SQObjectValue local_28;
  SQObjectType local_20;
  SQObjectValue local_18;
  SQCompiler *local_10;
  SQCompiler *this_local;
  
  local_10 = this;
  Lex(this);
  SVar8 = Expect(this,0x28);
  local_18 = SVar8._unVal;
  local_20 = SVar8._type;
  CommaExpr(this);
  SVar8 = Expect(this,0x29);
  local_28 = SVar8._unVal;
  local_30 = SVar8._type;
  SVar8 = Expect(this,0x7b);
  local_38 = SVar8._unVal;
  expr._0_4_ = SVar8._type;
  SStack_48 = SQFuncState::TopTarget(this->_fs);
  tonextcondjmp._7_1_ = 1;
  skipcondjmp = -1;
  __nbreaks__ = -1;
  local_68 = sqvector<long_long>::size(&this->_fs->_unresolvedbreaks);
  local_70 = 0;
  sqvector<long_long>::push_back(&this->_fs->_breaktargets,&local_70);
  while (SVar2 = skipcondjmp, this->_token == 300) {
    if ((tonextcondjmp._7_1_ & 1) == 0) {
      SQFuncState::AddInstruction(this->_fs,_OP_JMP,0,0,0,0);
      __nbreaks__ = SQFuncState::GetCurrentPos(this->_fs);
      SVar2 = skipcondjmp;
      pSVar1 = this->_fs;
      SVar5 = SQFuncState::GetCurrentPos(this->_fs);
      SQFuncState::SetIntructionParam(pSVar1,SVar2,1,SVar5 - skipcondjmp);
    }
    Lex(this);
    Expression(this);
    Expect(this,0x3a);
    SVar6 = SQFuncState::PopTarget(this->_fs);
    bVar4 = SQFuncState::IsLocal(this->_fs,SVar6);
    SStack_90 = SVar6;
    if (bVar4) {
      SStack_90 = SQFuncState::PushTarget(this->_fs,-1);
    }
    SQFuncState::AddInstruction(this->_fs,_OP_EQ,SStack_90,SVar6,SStack_48,0);
    SQFuncState::AddInstruction(this->_fs,_OP_JZ,SStack_90,0,0,0);
    if (bVar4) {
      SQFuncState::PopTarget(this->_fs);
    }
    SVar2 = __nbreaks__;
    if (__nbreaks__ != -1) {
      pSVar1 = this->_fs;
      SVar5 = SQFuncState::GetCurrentPos(this->_fs);
      SQFuncState::SetIntructionParam(pSVar1,SVar2,1,SVar5 - __nbreaks__);
    }
    skipcondjmp = SQFuncState::GetCurrentPos(this->_fs);
    SVar2 = (this->_scope).outers;
    SVar5 = (this->_scope).stacksize;
    (this->_scope).outers = this->_fs->_outers;
    SVar7 = SQFuncState::GetStackSize(this->_fs);
    (this->_scope).stacksize = SVar7;
    Statements(this);
    lVar3 = this->_fs->_outers;
    SVar7 = SQFuncState::GetStackSize(this->_fs);
    if ((SVar7 != (this->_scope).stacksize) &&
       (SQFuncState::SetStackSize(this->_fs,(this->_scope).stacksize), lVar3 != this->_fs->_outers))
    {
      SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
    }
    (this->_scope).outers = SVar2;
    (this->_scope).stacksize = SVar5;
    tonextcondjmp._7_1_ = 0;
  }
  if (skipcondjmp != -1) {
    pSVar1 = this->_fs;
    SVar5 = SQFuncState::GetCurrentPos(this->_fs);
    SQFuncState::SetIntructionParam(pSVar1,SVar2,1,SVar5 - skipcondjmp);
  }
  if (this->_token == 0x12d) {
    Lex(this);
    Expect(this,0x3a);
    SVar2 = (this->_scope).outers;
    SVar5 = (this->_scope).stacksize;
    (this->_scope).outers = this->_fs->_outers;
    SVar7 = SQFuncState::GetStackSize(this->_fs);
    (this->_scope).stacksize = SVar7;
    Statements(this);
    lVar3 = this->_fs->_outers;
    SVar7 = SQFuncState::GetStackSize(this->_fs);
    if ((SVar7 != (this->_scope).stacksize) &&
       (SQFuncState::SetStackSize(this->_fs,(this->_scope).stacksize), lVar3 != this->_fs->_outers))
    {
      SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
    }
    (this->_scope).outers = SVar2;
    (this->_scope).stacksize = SVar5;
  }
  Expect(this,0x7d);
  SQFuncState::PopTarget(this->_fs);
  SVar6 = sqvector<long_long>::size(&this->_fs->_unresolvedbreaks);
  local_68 = SVar6 - local_68;
  if (0 < (long)local_68) {
    ResolveBreaks(this,this->_fs,local_68);
  }
  sqvector<long_long>::pop_back(&this->_fs->_breaktargets);
  return;
}

Assistant:

void SwitchStatement()
    {
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));
        Expect(_SC('{'));
        SQInteger expr = _fs->TopTarget();
        bool bfirst = true;
        SQInteger tonextcondjmp = -1;
        SQInteger skipcondjmp = -1;
        SQInteger __nbreaks__ = _fs->_unresolvedbreaks.size();
        _fs->_breaktargets.push_back(0);
        while(_token == TK_CASE) {
            if(!bfirst) {
                _fs->AddInstruction(_OP_JMP, 0, 0);
                skipcondjmp = _fs->GetCurrentPos();
                _fs->SetIntructionParam(tonextcondjmp, 1, _fs->GetCurrentPos() - tonextcondjmp);
            }
            //condition
            Lex(); Expression(); Expect(_SC(':'));
            SQInteger trg = _fs->PopTarget();
            SQInteger eqtarget = trg;
            bool local = _fs->IsLocal(trg);
            if(local) {
                eqtarget = _fs->PushTarget(); //we need to allocate a extra reg
            }
            _fs->AddInstruction(_OP_EQ, eqtarget, trg, expr);
            _fs->AddInstruction(_OP_JZ, eqtarget, 0);
            if(local) {
                _fs->PopTarget();
            }

            //end condition
            if(skipcondjmp != -1) {
                _fs->SetIntructionParam(skipcondjmp, 1, (_fs->GetCurrentPos() - skipcondjmp));
            }
            tonextcondjmp = _fs->GetCurrentPos();
            BEGIN_SCOPE();
            Statements();
            END_SCOPE();
            bfirst = false;
        }
        if(tonextcondjmp != -1)
            _fs->SetIntructionParam(tonextcondjmp, 1, _fs->GetCurrentPos() - tonextcondjmp);
        if(_token == TK_DEFAULT) {
            Lex(); Expect(_SC(':'));
            BEGIN_SCOPE();
            Statements();
            END_SCOPE();
        }
        Expect(_SC('}'));
        _fs->PopTarget();
        __nbreaks__ = _fs->_unresolvedbreaks.size() - __nbreaks__;
        if(__nbreaks__ > 0)ResolveBreaks(_fs, __nbreaks__);
        _fs->_breaktargets.pop_back();
    }